

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O0

void Gia_ManAddDom(Gia_Man_t *p,Gia_Obj_t *pObj,int iDom0)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int local_20;
  int iDomNext;
  int iDom1;
  int iDom0_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjDom(p,pObj);
  if (iVar1 == -1) {
    Gia_ObjSetDom(p,pObj,iDom0);
  }
  else {
    local_20 = Gia_ObjDom(p,pObj);
    iDomNext = iDom0;
    do {
      while (local_20 < iDomNext) {
        pGVar2 = Gia_ManObj(p,local_20);
        iVar1 = Gia_ObjDom(p,pGVar2);
        bVar3 = iVar1 == local_20;
        local_20 = iVar1;
        if (bVar3) goto LAB_00718962;
      }
      if (local_20 <= iDomNext) {
        if (iDomNext == local_20) {
          Gia_ObjSetDom(p,pObj,iDomNext);
          return;
        }
        __assert_fail("iDom0 == iDom1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                      ,0x50,"void Gia_ManAddDom(Gia_Man_t *, Gia_Obj_t *, int)");
      }
      pGVar2 = Gia_ManObj(p,iDomNext);
      iVar1 = Gia_ObjDom(p,pGVar2);
      bVar3 = iVar1 != iDomNext;
      iDomNext = iVar1;
    } while (bVar3);
LAB_00718962:
    iVar1 = Gia_ObjId(p,pObj);
    Gia_ObjSetDom(p,pObj,iVar1);
  }
  return;
}

Assistant:

void Gia_ManAddDom( Gia_Man_t * p, Gia_Obj_t * pObj, int iDom0 )
{
    int iDom1, iDomNext;
    if ( Gia_ObjDom(p, pObj) == -1 )
    {
        Gia_ObjSetDom( p, pObj, iDom0 );
        return;
    }
    iDom1 = Gia_ObjDom( p, pObj );
    while ( 1 )
    {
        if ( iDom0 > iDom1 )
        {
            iDomNext = Gia_ObjDom( p, Gia_ManObj(p, iDom1) );
            if ( iDomNext == iDom1 )
                break;
            iDom1 = iDomNext;
            continue;
        }
        if ( iDom1 > iDom0 )
        {
            iDomNext = Gia_ObjDom( p, Gia_ManObj(p, iDom0) );
            if ( iDomNext == iDom0 )
                break;
            iDom0 = iDomNext;
            continue;
        }
        assert( iDom0 == iDom1 );
        Gia_ObjSetDom( p, pObj, iDom0 );
        return;
    }
    Gia_ObjSetDom( p, pObj, Gia_ObjId(p, pObj) );
}